

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void collectvalidlines(lua_State *L,Closure *f)

{
  Table *pTVar1;
  Table *in_RSI;
  lua_State *in_RDI;
  TValue *i_o_1;
  TValue *i_o;
  int i;
  int *lineinfo;
  Table *t;
  StkId in_stack_ffffffffffffffc8;
  lua_State *in_stack_ffffffffffffffd0;
  int local_24;
  
  if ((in_RSI == (Table *)0x0) || (in_RSI->flags != '\0')) {
    in_RDI->top->tt = 0;
  }
  else {
    pTVar1 = luaH_new(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                      (int)in_stack_ffffffffffffffc8);
    for (local_24 = 0; local_24 < *(int *)((long)&in_RSI->node[2].i_val.value + 4);
        local_24 = local_24 + 1) {
      in_stack_ffffffffffffffd0 =
           (lua_State *)luaH_setnum(in_RDI,in_RSI,(int)((ulong)pTVar1 >> 0x20));
      ((Value *)&in_stack_ffffffffffffffd0->next)->b = 1;
      *(int *)&in_stack_ffffffffffffffd0->tt = 1;
    }
    in_stack_ffffffffffffffc8 = in_RDI->top;
    *(Table **)&(in_stack_ffffffffffffffc8->value).b = pTVar1;
    in_stack_ffffffffffffffc8->tt = 5;
  }
  if ((long)in_RDI->stack_last - (long)in_RDI->top < 0x11) {
    luaD_growstack(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  }
  in_RDI->top = in_RDI->top + 1;
  return;
}

Assistant:

static void collectvalidlines(lua_State*L,Closure*f){
if(f==NULL||f->c.isC){
setnilvalue(L->top);
}
else{
Table*t=luaH_new(L,0,0);
int*lineinfo=f->l.p->lineinfo;
int i;
for(i=0;i<f->l.p->sizelineinfo;i++)
setbvalue(luaH_setnum(L,t,lineinfo[i]),1);
sethvalue(L,L->top,t);
}
incr_top(L);
}